

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  uchar c;
  byte c_00;
  long lVar1;
  char cVar2;
  ulong uVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar3 = 0;
  if (slen == 0) {
    uVar9 = 0;
    uVar11 = 0;
  }
  else {
    uVar9 = 0;
    uVar11 = 0;
    do {
      uVar7 = (uint)uVar3;
      uVar8 = uVar11 + 1;
      if (uVar11 + 1 < slen) {
        uVar8 = slen;
      }
      puVar4 = src + uVar11;
      if (*puVar4 == ' ') {
        uVar6 = uVar11;
        do {
          uVar11 = uVar8;
          if (uVar8 - 1 == uVar6) break;
          uVar11 = uVar6 + 1;
          lVar1 = uVar6 + 1;
          uVar6 = uVar11;
        } while (src[lVar1] == ' ');
      }
      if (slen == uVar11) break;
      if ((((slen - uVar11 < 2) || (src[uVar11] != '\r')) || (src[uVar11 + 1] != '\n')) &&
         (c = src[uVar11], c != '\n')) {
        if (*puVar4 == ' ') {
          return -0x2c;
        }
        if ((char)c < '\0') {
          return -0x2c;
        }
        if (c == '=') {
          if (1 < uVar7) {
            return -0x2c;
          }
          uVar3 = (ulong)(uVar7 + 1);
        }
        else {
          if (uVar7 != 0) {
            return -0x2c;
          }
          cVar2 = mbedtls_ct_base64_dec_value(c);
          uVar3 = 0;
          if (cVar2 < '\0') {
            return -0x2c;
          }
        }
        uVar9 = uVar9 + 1;
      }
      uVar7 = (uint)uVar3;
      uVar11 = uVar11 + 1;
    } while (uVar11 < slen);
    uVar3 = (ulong)uVar7;
  }
  iVar5 = 0;
  if (uVar9 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(((uint)uVar9 & 7) * 6 + 7 >> 3) +
            ((uVar9 >> 2 & 0xfffffffffffffffe) * 3 - uVar3);
    iVar5 = -0x2a;
    if ((dst != (uchar *)0x0) && (uVar3 <= dlen)) {
      puVar4 = dst;
      if (uVar11 != 0) {
        uVar3 = 0;
        uVar7 = 0;
        iVar5 = 0;
        uVar10 = 0;
        do {
          c_00 = src[uVar3];
          if ((0x20 < (ulong)c_00) || ((0x100002400U >> ((ulong)c_00 & 0x3f) & 1) == 0)) {
            uVar10 = uVar10 << 6;
            if (c_00 == 0x3d) {
              uVar7 = uVar7 + 1;
            }
            else {
              cVar2 = mbedtls_ct_base64_dec_value(c_00);
              uVar10 = uVar10 | (int)cVar2;
            }
            iVar5 = iVar5 + 1;
            if (iVar5 == 4) {
              *puVar4 = (uchar)(uVar10 >> 0x10);
              if (uVar7 < 2) {
                puVar4[1] = (uchar)(uVar10 >> 8);
                puVar4 = puVar4 + 2;
              }
              else {
                puVar4 = puVar4 + 1;
              }
              iVar5 = 0;
              if (uVar7 == 0) {
                *puVar4 = (uchar)uVar10;
                puVar4 = puVar4 + 1;
                iVar5 = 0;
                uVar7 = 0;
              }
            }
          }
          uVar3 = uVar3 + 1;
        } while (uVar11 != uVar3);
      }
      uVar3 = (long)puVar4 - (long)dst;
      iVar5 = 0;
    }
  }
  *olen = uVar3;
  return iVar5;
}

Assistant:

int mbedtls_base64_decode(unsigned char *dst, size_t dlen, size_t *olen,
                          const unsigned char *src, size_t slen)
{
    size_t i; /* index in source */
    size_t n; /* number of digits or trailing = in source */
    uint32_t x; /* value accumulator */
    unsigned accumulated_digits = 0;
    unsigned equals = 0;
    int spaces_present = 0;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for (i = n = 0; i < slen; i++) {
        /* Skip spaces before checking for EOL */
        spaces_present = 0;
        while (i < slen && src[i] == ' ') {
            ++i;
            spaces_present = 1;
        }

        /* Spaces at end of buffer are OK */
        if (i == slen) {
            break;
        }

        if ((slen - i) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n') {
            continue;
        }

        if (src[i] == '\n') {
            continue;
        }

        /* Space inside a line is an error */
        if (spaces_present) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] > 127) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] == '=') {
            if (++equals > 2) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        } else {
            if (equals != 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
            if (mbedtls_ct_base64_dec_value(src[i]) < 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        }
        n++;
    }

    if (n == 0) {
        *olen = 0;
        return 0;
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = (6 * (n >> 3)) + ((6 * (n & 0x7) + 7) >> 3);
    n -= equals;

    if (dst == NULL || dlen < n) {
        *olen = n;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    equals = 0;
    for (x = 0, p = dst; i > 0; i--, src++) {
        if (*src == '\r' || *src == '\n' || *src == ' ') {
            continue;
        }

        x = x << 6;
        if (*src == '=') {
            ++equals;
        } else {
            x |= mbedtls_ct_base64_dec_value(*src);
        }

        if (++accumulated_digits == 4) {
            accumulated_digits = 0;
            *p++ = MBEDTLS_BYTE_2(x);
            if (equals <= 1) {
                *p++ = MBEDTLS_BYTE_1(x);
            }
            if (equals <= 0) {
                *p++ = MBEDTLS_BYTE_0(x);
            }
        }
    }

    *olen = p - dst;

    return 0;
}